

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O0

int __thiscall Trick::getWinner(Trick *this,Contract *c)

{
  bool bVar1;
  reference ppVar2;
  pointer ppVar3;
  _Self local_38;
  undefined1 local_30 [8];
  pair<Card_*,_int> biggest;
  iterator it;
  Contract *c_local;
  Trick *this_local;
  
  biggest._8_8_ =
       std::__cxx11::list<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>::begin
                 (&this->_cards);
  ppVar2 = std::_List_iterator<std::pair<Card_*,_int>_>::operator*
                     ((_List_iterator<std::pair<Card_*,_int>_> *)&biggest.second);
  local_30 = (undefined1  [8])ppVar2->first;
  biggest.first = *(Card **)&ppVar2->second;
  std::_List_iterator<std::pair<Card_*,_int>_>::operator++
            ((_List_iterator<std::pair<Card_*,_int>_> *)&biggest.second);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>::end
                   (&this->_cards);
    bVar1 = std::operator!=((_Self *)&biggest.second,&local_38);
    if (!bVar1) break;
    ppVar3 = std::_List_iterator<std::pair<Card_*,_int>_>::operator->
                       ((_List_iterator<std::pair<Card_*,_int>_> *)&biggest.second);
    bVar1 = Card::isBigger(ppVar3->first,(Card *)local_30,c);
    if (bVar1) {
      ppVar2 = std::_List_iterator<std::pair<Card_*,_int>_>::operator*
                         ((_List_iterator<std::pair<Card_*,_int>_> *)&biggest.second);
      std::pair<Card_*,_int>::operator=((pair<Card_*,_int> *)local_30,ppVar2);
    }
    std::_List_iterator<std::pair<Card_*,_int>_>::operator++
              ((_List_iterator<std::pair<Card_*,_int>_> *)&biggest.second);
  }
  return (int)biggest.first;
}

Assistant:

int Trick::getWinner(Contract *c) {
    std::list<pair<Card *, int>>::iterator it = _cards.begin();
    pair<Card *, int> biggest = *it;
    for (++it; it != _cards.end(); ++it) {
        if (it->first->isBigger(biggest.first, c)) {
            biggest = *it;
        }
    }
    return biggest.second;
}